

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardConfigTab.cpp
# Opt level: O2

void __thiscall BindingEdit::setKey(BindingEdit *this,int key)

{
  Key *pKVar1;
  Key *pKVar2;
  
  pKVar2 = (this->mBindings)._M_elems + (long)this->mCursorColumn + (long)this->mCursorRow * 0xc;
  if (3 < (ulong)(long)this->mCursorRow) {
    pKVar2 = (this->mBindings)._M_elems + 0x30;
  }
  if (*pKVar2 != key) {
    if (key != 0) {
      pKVar1 = std::__find_if<Qt::Key*,__gnu_cxx::__ops::_Iter_equals_val<Qt::Key_const>>
                         (&this->mBindings,&this->mColumnWidth);
      if (pKVar1 != (Key *)&this->mColumnWidth) {
        *pKVar1 = *pKVar2;
      }
    }
    *pKVar2 = key;
    bindingsChanged(this);
    QWidget::update();
  }
  return;
}

Assistant:

void setKey(int key) {
        auto &dest = cursorKey();
        if (dest != key) {

            if (key) {
                // check if this key is already bound
                auto existing = std::find(mBindings.begin(), mBindings.end(), (Qt::Key)key);
                if (existing != mBindings.end()) {
                    // key is bound, overwrite with the cursor's old value
                    *existing = dest;
                }
            }
            dest = (Qt::Key)key;

            emit bindingsChanged();
            update();
        }
    }